

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByCamelcaseName(Descriptor *this,string_view camelcase_name)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  
  pFVar1 = FileDescriptorTables::FindFieldByCamelcaseName(this->file_->tables_,this,camelcase_name);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar2 = (FieldDescriptor *)0x0;
    if ((pFVar1->field_0x1 & 8) == 0) {
      pFVar2 = pFVar1;
    }
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByCamelcaseName(
    absl::string_view camelcase_name) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByCamelcaseName(this, camelcase_name);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}